

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_create(char *zipname,char **filenames,size_t len)

{
  char *__file;
  mz_bool mVar1;
  int iVar2;
  size_t sVar3;
  char *pArchive_name;
  char *name;
  undefined1 local_128 [4];
  mz_uint32 ext_attributes;
  stat file_stat;
  mz_zip_archive zip_archive;
  size_t i;
  int status;
  size_t len_local;
  char **filenames_local;
  char *zipname_local;
  
  i._4_4_ = 0;
  name._4_4_ = 0;
  if ((zipname == (char *)0x0) || (sVar3 = strlen(zipname), sVar3 == 0)) {
    return -1;
  }
  memset(file_stat.__glibc_reserved + 2,0,0x60);
  if (&stack0x00000000 == (undefined1 *)0x98) {
    return -1;
  }
  mVar1 = mz_zip_writer_init_file((mz_zip_archive *)(file_stat.__glibc_reserved + 2),zipname,0);
  if (mVar1 == 0) {
    return -1;
  }
  memset(local_128,0,0x90);
  zip_archive.m_pState = (mz_zip_internal_state *)0x0;
  do {
    if (len <= zip_archive.m_pState) {
LAB_0056b7c6:
      mz_zip_writer_finalize_archive((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
      mz_zip_writer_end((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
      return i._4_4_;
    }
    __file = filenames[(long)zip_archive.m_pState];
    if (__file == (char *)0x0) {
      i._4_4_ = -1;
      goto LAB_0056b7c6;
    }
    iVar2 = stat(__file,(stat *)local_128);
    if (iVar2 != 0) {
      return -1;
    }
    if (((uint)file_stat.st_nlink & 0x80) == 0) {
      name._4_4_ = name._4_4_ | 1;
    }
    name._4_4_ = (uint)file_stat.st_nlink << 0x10 | name._4_4_;
    pArchive_name = base_name(__file);
    mVar1 = mz_zip_writer_add_file
                      ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pArchive_name,__file,"",0,
                       6,name._4_4_);
    if (mVar1 == 0) {
      i._4_4_ = -1;
      goto LAB_0056b7c6;
    }
    zip_archive.m_pState =
         (mz_zip_internal_state *)((long)&((zip_archive.m_pState)->m_central_dir).m_p + 1);
  } while( true );
}

Assistant:

int zip_create(const char *zipname, const char *filenames[], size_t len) {
  int status = 0;
  size_t i;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint32 ext_attributes = 0;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    return -1;
  }

  // Create a new archive.
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return -1;
  }

  if (!mz_zip_writer_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive writer
    return -1;
  }

  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));

  for (i = 0; i < len; ++i) {
    const char *name = filenames[i];
    if (!name) {
      status = -1;
      break;
    }

    if (MZ_FILE_STAT(name, &file_stat) != 0) {
      // problem getting information - check errno
      return -1;
    }

    if ((file_stat.st_mode & 0200) == 0) {
      // MS-DOS read-only attribute
      ext_attributes |= 0x01;
    }
    ext_attributes |= (mz_uint32)((file_stat.st_mode & 0xFFFF) << 16);

    if (!mz_zip_writer_add_file(&zip_archive, base_name(name), name, "", 0,
                                ZIP_DEFAULT_COMPRESSION_LEVEL,
                                ext_attributes)) {
      // Cannot add file to zip_archive
      status = -1;
      break;
    }
  }

  mz_zip_writer_finalize_archive(&zip_archive);
  mz_zip_writer_end(&zip_archive);
  return status;
}